

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O0

bool __thiscall
google::protobuf::util::MessageDifferencer::MapEntryKeyComparator::IsMatch
          (MapEntryKeyComparator *this,Message *message1,Message *message2,int unpacked_any,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  bool bVar1;
  Scope SVar2;
  Descriptor *this_00;
  FieldDescriptor *field;
  Reflection *this_01;
  bool local_79;
  undefined1 local_60 [8];
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  current_parent_fields;
  bool treat_as_set;
  FieldDescriptor *key;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  *parent_fields_local;
  int unpacked_any_local;
  Message *message2_local;
  Message *message1_local;
  MapEntryKeyComparator *this_local;
  
  this_00 = Message::GetDescriptor(message1);
  field = Descriptor::FindFieldByNumber(this_00,1);
  SVar2 = MessageDifferencer::scope(this->message_differencer_);
  if (SVar2 == PARTIAL) {
    this_01 = Message::GetReflection(message1);
    bVar1 = Reflection::HasField(this_01,message1,field);
    local_79 = true;
    if (!bVar1) goto LAB_01b61cac;
  }
  local_79 = IsIgnored(this->message_differencer_,message1,message2,field,parent_fields);
LAB_01b61cac:
  current_parent_fields.
  super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = local_79;
  std::
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  ::vector((vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
            *)local_60,parent_fields);
  if ((current_parent_fields.
       super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    this_local._7_1_ =
         CompareFieldValueUsingParentFields
                   (this->message_differencer_,message1,message2,unpacked_any,field,-1,-1,
                    (vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                     *)local_60);
  }
  else {
    this_local._7_1_ =
         Compare(this->message_differencer_,message1,message2,unpacked_any,
                 (vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                  *)local_60);
  }
  std::
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  ::~vector((vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
             *)local_60);
  return this_local._7_1_;
}

Assistant:

bool MessageDifferencer::MapEntryKeyComparator::IsMatch(
    const Message& message1, const Message& message2, int unpacked_any,
    const std::vector<SpecificField>& parent_fields) const {
  // Map entry has its key in the field with tag 1.  See the comment for
  // map_entry in MessageOptions.
  const FieldDescriptor* key = message1.GetDescriptor()->FindFieldByNumber(1);
  // If key is not present in message1 and we're doing partial comparison or if
  // map key is explicitly ignored treat the field as set instead,
  const bool treat_as_set =
      (message_differencer_->scope() == PARTIAL &&
       !message1.GetReflection()->HasField(message1, key)) ||
      message_differencer_->IsIgnored(message1, message2, key, parent_fields);

  std::vector<SpecificField> current_parent_fields(parent_fields);
  if (treat_as_set) {
    return message_differencer_->Compare(message1, message2, unpacked_any,
                                         &current_parent_fields);
  }
  return message_differencer_->CompareFieldValueUsingParentFields(
      message1, message2, unpacked_any, key, -1, -1, &current_parent_fields);
}